

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::Block::GetTxOutProof
          (ByteData *__return_storage_ptr__,Block *this,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids)

{
  Serializer obj;
  ByteData local_98;
  Serializer local_80;
  MerkleBlock local_58;
  
  MerkleBlock::MerkleBlock(&local_58,this,txids);
  Serializer::Serializer(&local_80);
  SerializeBlockHeader(&local_98,this);
  Serializer::AddDirectBytes(&local_80,&local_98);
  if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  MerkleBlock::Serialize(&local_98,&local_58);
  Serializer::AddDirectBytes(&local_80,&local_98);
  if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Serializer::Output(__return_storage_ptr__,&local_80);
  local_80._vptr_Serializer = (_func_int **)&PTR__Serializer_00259878;
  if (local_80.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::~vector(&local_58.txids_);
  if (local_58.bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Block::GetTxOutProof(const std::vector<Txid>& txids) const {
  MerkleBlock merkle_block(*this, txids);
  Serializer obj;
  obj.AddDirectBytes(SerializeBlockHeader());
  obj.AddDirectBytes(merkle_block.Serialize());
  return obj.Output();
}